

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O3

void __thiscall
cmCustomCommand::cmCustomCommand
          (cmCustomCommand *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,char *comment,char *workingDirectory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Snapshot snapshot;
  size_t sVar2;
  char *pcVar3;
  cmListFileBacktrace local_88;
  Snapshot local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs,outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts,byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends,depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&(this->CommandLines).
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
  ;
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
  paVar1 = &local_88.Context.Name.field_2;
  local_88.Context.Name._M_string_length = 0;
  local_88.Context.Name.field_2._M_local_buf[0] = '\0';
  local_88.Context.Line = 0;
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  local_88.Context.Name._M_dataplus._M_p = (pointer)paVar1;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_88.Context);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.Context.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.Context.Name._M_dataplus._M_p,
                    CONCAT71(local_88.Context.Name.field_2._M_allocated_capacity._1_7_,
                             local_88.Context.Name.field_2._M_local_buf[0]) + 1);
  }
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ImplicitDepends).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = "";
  if (comment != (char *)0x0) {
    pcVar3 = comment;
  }
  (this->Comment)._M_dataplus._M_p = (pointer)&(this->Comment).field_2;
  sVar2 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Comment,pcVar3,pcVar3 + sVar2);
  pcVar3 = "";
  if (workingDirectory != (char *)0x0) {
    pcVar3 = workingDirectory;
  }
  (this->WorkingDirectory)._M_dataplus._M_p = (pointer)&(this->WorkingDirectory).field_2;
  sVar2 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->WorkingDirectory,pcVar3,pcVar3 + sVar2);
  this->HaveComment = comment != (char *)0x0;
  this->EscapeAllowMakeVars = false;
  this->EscapeOldStyle = true;
  if (mf != (cmMakefile *)0x0) {
    cmMakefile::GetBacktrace(&local_88,mf);
    std::__cxx11::string::_M_assign((string *)&this->Backtrace);
    (this->Backtrace).Context.Line = local_88.Context.Line;
    (this->Backtrace).Snapshot.State = local_88.Snapshot.State;
    (this->Backtrace).Snapshot.Position.Tree = local_88.Snapshot.Position.Tree;
    (this->Backtrace).Snapshot.Position.Position = local_88.Snapshot.Position.Position;
    cmListFileBacktrace::~cmListFileBacktrace(&local_88);
  }
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand(cmMakefile const* mf,
                                 const std::vector<std::string>& outputs,
                                 const std::vector<std::string>& byproducts,
                                 const std::vector<std::string>& depends,
                                 const cmCustomCommandLines& commandLines,
                                 const char* comment,
                                 const char* workingDirectory):
  Outputs(outputs),
  Byproducts(byproducts),
  Depends(depends),
  CommandLines(commandLines),
  Backtrace(),
  Comment(comment?comment:""),
  WorkingDirectory(workingDirectory?workingDirectory:""),
  HaveComment(comment?true:false),
  EscapeAllowMakeVars(false),
  EscapeOldStyle(true)
{
  if(mf)
    {
    this->Backtrace = mf->GetBacktrace();
    }
}